

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O3

void __thiscall MT32Emu::PartialManager::polyFreed(PartialManager *this,Poly *poly)

{
  uint uVar1;
  Part *this_00;
  Poly *this_01;
  Bit32u partNum;
  ulong uVar2;
  
  if (this->firstFreePolyIndex == 0) {
    Synth::printDebug(this->synth,
                      "PartialManager Error: Cannot return freed poly, currently active polys:\n");
    uVar2 = 0;
    do {
      this_00 = Synth::getPart(this->synth,(Bit8u)uVar2);
      this_01 = Part::getFirstActivePoly(this_00);
      uVar1 = 0;
      if (this_01 != (Poly *)0x0) {
        uVar1 = 0;
        do {
          this_01 = Poly::getNext(this_01);
          uVar1 = uVar1 + 1;
        } while (this_01 != (Poly *)0x0);
      }
      Synth::printDebug(this->synth,"Part: %i, active poly count: %i\n",uVar2,(ulong)uVar1);
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 9);
  }
  else {
    uVar1 = this->firstFreePolyIndex - 1;
    this->firstFreePolyIndex = uVar1;
    this->freePolys[uVar1] = poly;
  }
  Poly::setPart(poly,(Part *)0x0);
  return;
}

Assistant:

void PartialManager::polyFreed(Poly *poly) {
	if (0 == firstFreePolyIndex) {
		synth->printDebug("PartialManager Error: Cannot return freed poly, currently active polys:\n");
		for (Bit32u partNum = 0; partNum < 9; partNum++) {
			const Poly *activePoly = synth->getPart(partNum)->getFirstActivePoly();
			Bit32u polyCount = 0;
			while (activePoly != NULL) {
				activePoly = activePoly->getNext();
				polyCount++;
			}
			synth->printDebug("Part: %i, active poly count: %i\n", partNum, polyCount);
		}
	} else {
		firstFreePolyIndex--;
		freePolys[firstFreePolyIndex] = poly;
	}
	poly->setPart(NULL);
}